

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RandomUniformLikeLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::RandomUniformLikeLayerParams>
          (Arena *arena)

{
  RandomUniformLikeLayerParams *pRVar1;
  
  if (arena != (Arena *)0x0) {
    pRVar1 = DoCreateMessage<CoreML::Specification::RandomUniformLikeLayerParams>(arena);
    return pRVar1;
  }
  pRVar1 = (RandomUniformLikeLayerParams *)operator_new(0x28);
  CoreML::Specification::RandomUniformLikeLayerParams::RandomUniformLikeLayerParams
            (pRVar1,(Arena *)0x0,false);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }